

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::factorizeAndRecompute(SPxSolverBase<double> *this)

{
  int iVar1;
  Type TVar2;
  Verbosity VVar3;
  SPxSolverBase<double> *in_RDI;
  SPxSolverBase<double> *unaff_retaddr;
  Verbosity old_verbosity;
  SPxSolverBase<double> *in_stack_00000070;
  SPxSolverBase<double> *in_stack_00000080;
  SPxSolverBase<double> *in_stack_00000090;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffff4;
  SPxSolverBase<double> *x;
  
  x = in_RDI;
  iVar1 = SPxBasisBase<double>::lastUpdate(&in_RDI->super_SPxBasisBase<double>);
  if (0 < iVar1) {
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x75])();
  }
  computeFrhs(in_stack_00000090);
  SPxBasisBase<double>::solve
            ((SPxBasisBase<double> *)unaff_retaddr,(VectorBase<double> *)x,
             (VectorBase<double> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  TVar2 = type(in_RDI);
  if (TVar2 == LEAVE) {
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7d])();
  }
  else {
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7c])();
  }
  SPxBasisBase<double>::coSolve
            ((SPxBasisBase<double> *)unaff_retaddr,(VectorBase<double> *)x,
             (VectorBase<double> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  computePvec(unaff_retaddr);
  forceRecompNonbasicValue(in_RDI);
  if ((in_RDI->spxout != (SPxOut *)0x0) &&
     (VVar3 = SPxOut::getVerbosity(in_RDI->spxout), 3 < (int)VVar3)) {
    VVar3 = SPxOut::getVerbosity(in_RDI->spxout);
    uVar4 = 4;
    (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&stack0xfffffffffffffff0);
    soplex::operator<<((SPxOut *)CONCAT44(VVar3,uVar4),(char *)in_RDI);
    (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&stack0xfffffffffffffff4);
  }
  TVar2 = type(in_RDI);
  if (TVar2 == LEAVE) {
    computeFtest(in_stack_00000080);
  }
  else {
    computeCoTest(in_stack_00000070);
    computeTest(in_stack_00000070);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::factorizeAndRecompute()
   {
      // refactorize to eliminate accumulated errors from LU updates
      if(this->lastUpdate() > 0)
         factorize();

      computeFrhs();
      SPxBasisBase<R>::solve(*theFvec, *theFrhs);
      type() == LEAVE ? computeLeaveCoPrhs() : computeEnterCoPrhs();

      SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
      computePvec();

      forceRecompNonbasicValue();

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- checking feasibility and optimality\n")

      if(type() == LEAVE)
         computeFtest();
      else
      {
         computeCoTest();
         computeTest();
      }
   }